

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

int llvm::APInt::tcMultiply(WordType *dst,WordType *lhs,WordType *rhs,uint parts)

{
  uint uVar1;
  uint uVar2;
  uint dstParts;
  long lVar3;
  
  if ((dst != lhs) && (dst != rhs)) {
    if (parts != 0) {
      *dst = 0;
      if (parts != 1) {
        memset(dst + 1,0,(ulong)(parts - 1) << 3);
      }
      lVar3 = 0;
      uVar2 = 0;
      dstParts = parts;
      do {
        uVar1 = tcMultiplyPart((WordType *)((long)dst + lVar3),lhs,*(WordType *)((long)rhs + lVar3),
                               0,parts,dstParts,true);
        uVar2 = uVar2 | uVar1;
        dstParts = dstParts - 1;
        lVar3 = lVar3 + 8;
      } while ((ulong)(parts + (parts == 0)) << 3 != lVar3);
      return uVar2;
    }
    __assert_fail("parts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x892,"static void llvm::APInt::tcSet(WordType *, WordType, unsigned int)");
  }
  __assert_fail("dst != lhs && dst != rhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9ad,
                "static int llvm::APInt::tcMultiply(WordType *, const WordType *, const WordType *, unsigned int)"
               );
}

Assistant:

int APInt::tcMultiply(WordType *dst, const WordType *lhs,
                      const WordType *rhs, unsigned parts) {
  assert(dst != lhs && dst != rhs);

  int overflow = 0;
  tcSet(dst, 0, parts);

  for (unsigned i = 0; i < parts; i++)
    overflow |= tcMultiplyPart(&dst[i], lhs, rhs[i], 0, parts,
                               parts - i, true);

  return overflow;
}